

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

bool __thiscall ON_BezierCurve::ReserveCVCapacity(ON_BezierCurve *this,int desired_capacity)

{
  double *pdVar1;
  bool local_15;
  bool rc;
  int desired_capacity_local;
  ON_BezierCurve *this_local;
  
  local_15 = false;
  if (this->m_cv_capacity < desired_capacity) {
    if (this->m_cv == (double *)0x0) {
      pdVar1 = (double *)onmalloc((long)desired_capacity << 3);
      this->m_cv = pdVar1;
      local_15 = this->m_cv != (double *)0x0;
      if (local_15) {
        this->m_cv_capacity = desired_capacity;
      }
      else {
        this->m_cv_capacity = 0;
      }
    }
    else if (0 < this->m_cv_capacity) {
      pdVar1 = (double *)onrealloc(this->m_cv,(long)desired_capacity << 3);
      this->m_cv = pdVar1;
      local_15 = this->m_cv != (double *)0x0;
      if (local_15) {
        this->m_cv_capacity = desired_capacity;
      }
      else {
        this->m_cv_capacity = 0;
      }
    }
  }
  else {
    local_15 = true;
  }
  return local_15;
}

Assistant:

bool ON_BezierCurve::ReserveCVCapacity( int desired_capacity )
{
	bool rc = false;
	if ( desired_capacity > m_cv_capacity ) {
		if ( !m_cv ) {
			m_cv = (double*)onmalloc(desired_capacity*sizeof(*m_cv));
			if ( !m_cv ) {
				m_cv_capacity = 0;
			}
			else {
				m_cv_capacity = desired_capacity;
				rc = true;
			}
		}
		else if ( m_cv_capacity > 0 ) {
			m_cv = (double*)onrealloc(m_cv,desired_capacity*sizeof(*m_cv));
			if ( !m_cv ) {
				m_cv_capacity = 0;
			}
			else {
				m_cv_capacity = desired_capacity;
				rc = true;
			}
		}
	} 
	else 
		rc =true;
	return rc;
}